

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_client.cc
# Opt level: O2

bool bssl::parse_server_hello_tls13
               (SSL_HANDSHAKE *hs,ParsedServerHello *out,uint8_t *out_alert,SSLMessage *msg)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  InplaceVector<unsigned_char,_32UL> *pIVar5;
  uint16_t uVar6;
  Span<const_unsigned_char> rhs;
  
  bVar1 = ssl_parse_server_hello(out,out_alert,msg);
  if (bVar1) {
    iVar2 = SSL_is_dtls(hs->ssl);
    iVar3 = SSL_is_dtls(hs->ssl);
    pIVar5 = (InplaceVector<unsigned_char,_32UL> *)0x0;
    uVar4 = 0;
    if (iVar3 == 0) {
      uVar4 = (ulong)(hs->session_id).size_;
      pIVar5 = &hs->session_id;
    }
    uVar6 = 0xfefd;
    if (iVar2 == 0) {
      uVar6 = 0x303;
    }
    if ((((uVar6 == out->legacy_version) && (out->compression_method == '\0')) &&
        (rhs.size_ = uVar4, rhs.data_ = (uchar *)pIVar5,
        bVar1 = internal::operator!=((Span<const_unsigned_char>)out->session_id,rhs), !bVar1)) &&
       ((out->extensions).len != 0)) {
      return true;
    }
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                  ,0x80);
    *out_alert = '2';
  }
  return false;
}

Assistant:

static bool parse_server_hello_tls13(const SSL_HANDSHAKE *hs,
                                     ParsedServerHello *out, uint8_t *out_alert,
                                     const SSLMessage &msg) {
  if (!ssl_parse_server_hello(out, out_alert, msg)) {
    return false;
  }
  uint16_t expected_version =
      SSL_is_dtls(hs->ssl) ? DTLS1_2_VERSION : TLS1_2_VERSION;
  // DTLS 1.3 disables "compatibility mode" (RFC 8446, appendix D.4). When
  // disabled, servers MUST NOT echo the legacy_session_id (RFC 9147, section
  // 5). The client could have sent a session ID indicating its willingness to
  // resume a DTLS 1.2 session, so just checking that the session IDs match is
  // incorrect.
  Span<const uint8_t> expected_session_id =
      SSL_is_dtls(hs->ssl) ? Span<const uint8_t>() : Span(hs->session_id);

  // RFC 8446 fixes some legacy values. Check them.
  if (out->legacy_version != expected_version ||  //
      out->compression_method != 0 ||
      Span<const uint8_t>(out->session_id) != expected_session_id ||
      CBS_len(&out->extensions) == 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }
  return true;
}